

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

int read_mv_component(aom_reader *r,nmv_component *mvcomp,int use_subpel,int usehp)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  aom_cdf_prob (*cdf) [5];
  uint uVar6;
  aom_cdf_prob (*cdf_00) [3];
  uint uVar7;
  ulong uVar8;
  aom_cdf_prob *cdf_01;
  
  iVar1 = aom_read_symbol_(r,mvcomp->sign_cdf,2);
  uVar2 = aom_read_symbol_(r,mvcomp->classes_cdf,0xb);
  if (uVar2 == 0) {
    uVar7 = aom_read_symbol_(r,mvcomp->class0_cdf,2);
    iVar3 = 1;
  }
  else {
    cdf_00 = mvcomp->bits_cdf;
    uVar5 = 0;
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    uVar7 = 0;
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = aom_read_symbol_(r,*cdf_00,2);
      uVar7 = uVar7 | iVar3 << ((byte)uVar5 & 0x1f);
      cdf_00 = cdf_00 + 1;
    }
    iVar3 = (2 << ((char)uVar2 + 2U & 0x1f)) + 1;
  }
  if (use_subpel == 0) {
    uVar2 = 1;
    uVar6 = 6;
  }
  else {
    cdf = mvcomp->class0_fp_cdf + (int)uVar7;
    if (uVar2 != 0) {
      cdf = &mvcomp->fp_cdf;
    }
    iVar4 = aom_read_symbol_(r,*cdf,4);
    if (usehp == 0) {
      uVar2 = 1;
    }
    else {
      cdf_01 = mvcomp->class0_hp_cdf;
      if (uVar2 != 0) {
        cdf_01 = mvcomp->hp_cdf;
      }
      uVar2 = aom_read_symbol_(r,cdf_01,2);
    }
    uVar6 = iVar4 * 2;
  }
  iVar3 = iVar3 + (uVar7 << 3 | uVar2 | uVar6);
  iVar4 = -iVar3;
  if (iVar1 == 0) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

static int read_mv_component(aom_reader *r, nmv_component *mvcomp,
                             int use_subpel, int usehp) {
  int mag, d, fr, hp;
  const int sign = aom_read_symbol(r, mvcomp->sign_cdf, 2, ACCT_STR);
  const int mv_class =
      aom_read_symbol(r, mvcomp->classes_cdf, MV_CLASSES, ACCT_STR);
  const int class0 = mv_class == MV_CLASS_0;

  // Integer part
  if (class0) {
    d = aom_read_symbol(r, mvcomp->class0_cdf, CLASS0_SIZE, ACCT_STR);
    mag = 0;
  } else {
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    d = 0;
    for (int i = 0; i < n; ++i)
      d |= aom_read_symbol(r, mvcomp->bits_cdf[i], 2, ACCT_STR) << i;
    mag = CLASS0_SIZE << (mv_class + 2);
  }

  if (use_subpel) {
    // Fractional part
    fr = aom_read_symbol(r, class0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf,
                         MV_FP_SIZE, ACCT_STR);

    // High precision part (if hp is not used, the default value of the hp is 1)
    hp = usehp ? aom_read_symbol(
                     r, class0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf, 2,
                     ACCT_STR)
               : 1;
  } else {
    fr = 3;
    hp = 1;
  }

  // Result
  mag += ((d << 3) | (fr << 1) | hp) + 1;
  return sign ? -mag : mag;
}